

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::BuildReflexes(ImTriangulator *this)

{
  bool bVar1;
  int *in_RDI;
  int i;
  ImTriangulatorNode *n1;
  int local_14;
  ImTriangulatorNode *local_10;
  
  local_10 = *(ImTriangulatorNode **)(in_RDI + 2);
  for (local_14 = *in_RDI; -1 < local_14; local_14 = local_14 + -1) {
    bVar1 = ImTriangleIsClockwise(&local_10->Prev->Pos,&local_10->Pos,&local_10->Next->Pos);
    if (!bVar1) {
      local_10->Type = ImTriangulatorNodeType_Reflex;
      ImTriangulatorNodeSpan::push_back((ImTriangulatorNodeSpan *)(in_RDI + 8),local_10);
    }
    local_10 = local_10->Next;
  }
  return;
}

Assistant:

void ImTriangulator::BuildReflexes()
{
    ImTriangulatorNode* n1 = _Nodes;
    for (int i = _TrianglesLeft; i >= 0; i--, n1 = n1->Next)
    {
        if (ImTriangleIsClockwise(n1->Prev->Pos, n1->Pos, n1->Next->Pos))
            continue;
        n1->Type = ImTriangulatorNodeType_Reflex;
        _Reflexes.push_back(n1);
    }
}